

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O3

Class ownerForMethod(Class cls,SEL sel)

{
  objc_slot2 *poVar1;
  objc_slot2 *poVar2;
  
  poVar1 = objc_get_slot2(cls,sel,(uint64_t *)0x0);
  while( true ) {
    if (poVar1 == (objc_slot2 *)0x0) {
      return (Class)0x0;
    }
    if (cls->super_class == (Class)0x0) break;
    poVar2 = objc_get_slot2(cls->super_class,sel,(uint64_t *)0x0);
    if (poVar2 != poVar1) {
      return cls;
    }
    cls = cls->super_class;
    poVar1 = objc_get_slot2(cls,sel,(uint64_t *)0x0);
  }
  return cls;
}

Assistant:

static Class ownerForMethod(Class cls, SEL sel)
{
	struct objc_slot2 *slot = objc_get_slot2(cls, sel, NULL);
	if (slot == NULL)
	{
		return Nil;
	}
	if (cls->super_class == NULL)
	{
		return cls;
	}
	if (objc_get_slot2(cls->super_class, sel, NULL) == slot)
	{
		return ownerForMethod(cls->super_class, sel);
	}
	return cls;
}